

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O1

void ThreadContext::ProbeCurrentStackNoDispose(size_t size,ScriptContext *scriptContext)

{
  ThreadContext *pTVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  ThreadContextTLSEntry *this;
  ThreadContext *pTVar5;
  
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                       ,0x6ef,"(scriptContext != nullptr)","scriptContext != nullptr");
    if (!bVar3) goto LAB_007bbe9d;
    *puVar4 = 0;
  }
  pTVar1 = scriptContext->threadContext;
  this = ThreadContextTLSEntry::GetEntryForCurrentThread();
  if (this == (ThreadContextTLSEntry *)0x0) {
    pTVar5 = (ThreadContext *)0x0;
  }
  else {
    pTVar5 = ThreadContextTLSEntry::GetThreadContext(this);
  }
  if (pTVar1 != pTVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                       ,0x6f0,"(scriptContext->GetThreadContext() == GetContextForCurrentThread())",
                       "scriptContext->GetThreadContext() == GetContextForCurrentThread()");
    if (!bVar3) {
LAB_007bbe9d:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  ProbeStackNoDispose(scriptContext->threadContext,size,scriptContext,(PVOID)0x0);
  return;
}

Assistant:

void
ThreadContext::ProbeCurrentStackNoDispose(size_t size, Js::ScriptContext *scriptContext)
{
    Assert(scriptContext != nullptr);
    Assert(scriptContext->GetThreadContext() == GetContextForCurrentThread());
    scriptContext->GetThreadContext()->ProbeStackNoDispose(size, scriptContext);
}